

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>
::DoMarkForResultVars
          (ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>
           *this)

{
  bool bVar1;
  ExpressionAcceptanceLevel EVar2;
  size_type sVar3;
  reference con_00;
  CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>
  *pCVar4;
  ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>
  *in_RDI;
  CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>
  *con;
  value_type *cnt;
  int i;
  ExpressionAcceptanceLevel eal;
  size_type in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  BasicConstraintKeeper *in_stack_ffffffffffffffe0;
  int iVar5;
  int iVar6;
  
  EVar2 = BasicConstraintKeeper::GetChosenAcceptanceLevelEXPR(in_stack_ffffffffffffffe0);
  if (EVar2 != NotAccepted) {
    iVar5 = 0;
    while (iVar6 = iVar5,
          sVar3 = std::
                  deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container>_>
                  ::size((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container>_>
                          *)0x545299), iVar5 < (int)sVar3) {
      con_00 = std::
               deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container>_>
               ::operator[]((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container>_>
                             *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
      bVar1 = Container::IsRedundant((Container *)CONCAT44(iVar5,in_stack_ffffffffffffffd0));
      if (!bVar1) {
        pCVar4 = Container::GetCon((Container *)0x5452d7);
        GetConverter(in_RDI);
        Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
        ::
        ConsiderMarkingResultVar<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::NumberofConstId>>
                  ((Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    *)CONCAT44(EVar2,iVar6),
                   (CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>
                    *)con_00,(int)((ulong)pCVar4 >> 0x20),(ExpressionAcceptanceLevel)pCVar4);
      }
      iVar5 = iVar6 + 1;
    }
  }
  return;
}

Assistant:

void DoMarkForResultVars() {
    const auto eal        // as expr only
        = GetChosenAcceptanceLevelEXPR();
    if (ExpressionAcceptanceLevel::NotAccepted!=eal) {    // accepted
      for (int i=0; i< (int)cons_.size(); ++i) {
        const auto& cnt = cons_[i];
        if (!cnt.IsRedundant()) {
          const auto& con = cnt.GetCon();
          // Delegate actual logic to Converter
          GetConverter().ConsiderMarkingResultVar(con, i, eal);
        }
      }
    }
  }